

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall CPU::MOS6502::State::ExecutionState::ExecutionState(ExecutionState *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<CPU::MOS6502::State::ExecutionState>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058daa0;
  if (Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    Reflection::Enum::declare<CPU::MOS6502::State::ExecutionState::Phase>
              ("Phase","Instruction, Stopped, Waiting, Jammed, Ready");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"phase",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::
    declare<CPU::MOS6502::State::ExecutionState::Phase>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->phase,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"micro_program",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->micro_program,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"micro_program_offset",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,
               &this->micro_program_offset,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"operation",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operation,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"operand",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operand,&local_28
              );
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"address",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->address,&local_28
              );
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"next_address",&local_29)
    ;
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->next_address,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State::ExecutionState::ExecutionState() {
	if(needs_declare()) {
		AnnounceEnum(Phase);
		DeclareField(phase);
		DeclareField(micro_program);
		DeclareField(micro_program_offset);
		DeclareField(operation);
		DeclareField(operand);
		DeclareField(address);
		DeclareField(next_address);
	}
}